

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall ccs::anon_unknown_0::Lexer::multilineComment(Lexer *this)

{
  undefined8 uVar1;
  int iVar2;
  string *psVar3;
  ostringstream _message;
  long local_1b0;
  long local_1a8;
  ostringstream local_190 [376];
  
  do {
    while( true ) {
      while( true ) {
        iVar2 = Buf::get(&this->stream_);
        if (iVar2 != 0x2a) break;
        iVar2 = std::istream::peek();
        if (iVar2 == 0x2f) {
          Buf::get(&this->stream_);
          return;
        }
      }
      if (iVar2 != 0x2f) break;
      iVar2 = std::istream::peek();
      if (iVar2 == 0x2a) {
        Buf::get(&this->stream_);
        multilineComment(this);
      }
    }
  } while (iVar2 != -1);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Unterminated multi-line comment",0x1f);
  psVar3 = (string *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  uVar1 = *(undefined8 *)&(this->stream_).line_;
  *(string **)psVar3 = psVar3 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar3,local_1b0,local_1a8 + local_1b0);
  *(undefined8 *)(psVar3 + 0x20) = uVar1;
  __cxa_throw(psVar3,&(anonymous_namespace)::parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

void multilineComment() {
    while (true) {
      int c = stream_.get();
      if (c == EOF)
        THROW(stream_.location(), "Unterminated multi-line comment");
      if (c == '*' && stream_.peek() == '/') {
        stream_.get();
        return;
      }
      if (c == '/' && stream_.peek() == '*') {
        stream_.get();
        multilineComment();
      }
    }
  }